

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::alert_manager::
emplace_alert<libtorrent::dht_stats_alert,std::vector<libtorrent::dht_routing_bucket,std::allocator<libtorrent::dht_routing_bucket>>,std::vector<libtorrent::dht_lookup,std::allocator<libtorrent::dht_lookup>>,libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>&>
          (alert_manager *this,
          vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
          *args,vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *args_1,
          digest32<160L> *args_2,basic_endpoint<boost::asio::ip::udp> *args_3)

{
  int iVar1;
  type a;
  unique_lock<std::recursive_mutex> lock;
  
  ::std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&this->m_mutex);
  iVar1 = this->m_generation;
  if ((this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems
      [iVar1].m_num_items < this->m_queue_size_limit) {
    a = heterogeneous_queue<libtorrent::alert>::
        emplace_back<libtorrent::dht_stats_alert,libtorrent::aux::stack_allocator&,std::vector<libtorrent::dht_routing_bucket,std::allocator<libtorrent::dht_routing_bucket>>,std::vector<libtorrent::dht_lookup,std::allocator<libtorrent::dht_lookup>>,libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>&>
                  ((this->m_alerts).
                   super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems +
                   iVar1,(this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>.
                         _M_elems + iVar1,args,args_1,args_2,args_3);
    maybe_notify(this,&a->super_alert);
  }
  else {
    ::std::bitset<128UL>::set(&this->m_dropped,0x53,true);
  }
  ::std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void emplace_alert(Args&&... args) try
		{
			std::unique_lock<std::recursive_mutex> lock(m_mutex);

			heterogeneous_queue<alert>& queue = m_alerts[m_generation];

			// don't add more than this number of alerts, unless it's a
			// high priority alert, in which case we try harder to deliver it
			// for high priority alerts, double the upper limit
			if (queue.size() / (1 + static_cast<int>(T::priority)) >= m_queue_size_limit)
			{
				// record that we dropped an alert of this type
				m_dropped.set(T::alert_type);
				return;
			}

			T& alert = queue.emplace_back<T>(
				m_allocations[m_generation], std::forward<Args>(args)...);

			maybe_notify(&alert);
		}
		catch (std::bad_alloc const&)
		{
			// record that we dropped an alert of this type
			std::unique_lock<std::recursive_mutex> lock(m_mutex);
			m_dropped.set(T::alert_type);
		}